

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void handle_busy_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  anomalous_callbacks *cbs;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  char *__format;
  ulong uVar6;
  long lVar7;
  shared_data data;
  fdb_iterator *itr;
  char bodybuf [16];
  char metabuf [16];
  char keybuf [16];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_doc *local_228 [32];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  cbs = get_default_anon_cbs();
  cbs->pwrite_cb = pwrite_hang_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  data.dbfile = (fdb_file_handle *)0x0;
  data.db = (fdb_kvs_handle *)0x0;
  data.iterator = (fdb_iterator *)0x0;
  data.test_handle_busy = false;
  data._25_7_ = 0;
  filemgr_ops_anomalous_init(cbs,&data);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.seqtree_opt = '\x01';
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fVar1 = fdb_open(&data.dbfile,"anomaly_test5",&fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1b2);
    handle_busy_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x1b2,"void handle_busy_test()");
  }
  fVar1 = fdb_kvs_open_default(data.dbfile,&data.db,&kvs_config);
  handle = data.db;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1b4);
    handle_busy_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x1b4,"void handle_busy_test()");
  }
  lVar7 = 0;
  uVar6 = 0;
  while (uVar6 != 0x20) {
    sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar6 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar6 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_228 + lVar7),keybuf,sVar2 + 1,metabuf,sVar3 + 1,bodybuf,
                   sVar4 + 1);
    fVar1 = fdb_set(handle,local_228[uVar6]);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 8;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x1c0);
      handle_busy_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x1c0,"void handle_busy_test()");
    }
  }
  fVar1 = fdb_commit(data.dbfile,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1c5);
    handle_busy_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x1c5,"void handle_busy_test()");
  }
  fVar1 = fdb_iterator_init(handle,&itr,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    data.test_handle_busy = true;
    fVar1 = fdb_set(handle,local_228[0]);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      data.iterator = itr;
      fdb_iterator_close(itr);
      data._24_8_ = (ulong)(uint7)data._25_7_ << 8;
      fdb_close(data.dbfile);
      for (uVar5 = 0x1f; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
        fdb_doc_free(local_228[uVar5]);
      }
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (handle_busy_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"Handle Busy Test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1ce);
    handle_busy_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x1ce,"void handle_busy_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
          ,0x1c9);
  handle_busy_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x1c9,"void handle_busy_test()");
}

Assistant:

void handle_busy_test()
{
    TEST_INIT();

    memleak_start();

    int n = 32;
    int i = 0, r;

    char keybuf[16], metabuf[16], bodybuf[16];
    fdb_doc **doc = alca(fdb_doc *, n);
    struct shared_data data;
    fdb_kvs_handle *db;
    fdb_iterator *itr;
    fdb_status status;

    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_hang_cb = get_default_anon_cbs();

    // Modify the pwrite callback to redirect to test-specific function
    write_hang_cb->pwrite_cb = &pwrite_hang_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    memset(&data, 0, sizeof(struct shared_data));

    // Create anomalous behavior with shared handle for the callback ctx
    filemgr_ops_anomalous_init(write_hang_cb, &data);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&data.dbfile, "anomaly_test5", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(data.dbfile, &data.db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    db = data.db;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1,
            (void*)metabuf, strlen(metabuf) + 1, (void*)bodybuf,
            strlen(bodybuf) + 1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(data.dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_iterator_init(db, &itr, NULL, 0, NULL, 0,
                               FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Set callback context to call bad_thread() and do a set invoking callback
    data.test_handle_busy = 1;
    status = fdb_set(db, doc[0]);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test iterator callbacks by attemping a set call on the iterator handle..
    data.iterator = itr;
    // TODO: remove if concurrent access on iterator handle can never happen
    //status = fdb_set(itr->handle, doc[0]);
    //TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_close(itr);
    data.test_handle_busy = 0;
    fdb_close(data.dbfile);

    for (i = n - 1; i >=0; --i) {
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Handle Busy Test");
}